

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::CaseInsensitiveMatchAndConsume(void)

{
  bool bVar1;
  StringPiece sp;
  string text;
  string result;
  Arg *args_1 [1];
  Arg *args [1];
  StringPiece local_228;
  char *local_218;
  int local_210;
  char local_208 [16];
  Arg local_1f8;
  Arg local_1e8;
  undefined1 local_1d8 [16];
  Arg local_1c8;
  Arg *local_1b8;
  LogMessage local_1b0;
  
  local_1e8.parser_ = (Parser)0x0;
  local_1d8[0] = 0;
  local_218 = local_208;
  local_1e8.arg_ = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"A fish named *Wanda*","");
  local_228.ptr_ = local_218;
  local_228.length_ = local_210;
  RE2::RE2((RE2 *)&local_1b0,"(?i)([wand]{5})");
  local_1b8 = &local_1c8;
  local_1c8.parser_ = RE2::Arg::parse_string;
  local_1f8.arg_ = local_228.ptr_;
  local_1f8.parser_ = (Parser)CONCAT44(local_1f8.parser_._4_4_,local_228.length_);
  local_1c8.arg_ = &local_1e8;
  bVar1 = RE2::PartialMatchN((StringPiece *)&local_1f8,(RE2 *)&local_1b0,&local_1b8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ce,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: RE2::PartialMatch(sp, \"(?i)([wand]{5})\", &result)",0x3f);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  RE2::RE2((RE2 *)&local_1b0,"(?i)([wand]{5})");
  local_1f8.parser_ = RE2::Arg::parse_string;
  local_1f8.arg_ = &local_1e8;
  local_1c8.arg_ = &local_1f8;
  bVar1 = RE2::FindAndConsumeN(&local_228,(RE2 *)&local_1b0,(Arg **)&local_1c8,1);
  RE2::~RE2((RE2 *)&local_1b0);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4cf,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0.str_,
               "Check failed: RE2::FindAndConsume(&sp, \"(?i)([wand]{5})\", &result)",0x42);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if ((undefined1 *)local_1e8.arg_ != local_1d8) {
    operator_delete(local_1e8.arg_);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}